

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SliceBase.h
# Opt level: O0

bool __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::hasTag
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this,uint64_t tagId)

{
  Exception *this_00;
  undefined8 uVar1;
  char *in_RSI;
  uint64_t tag;
  uint8_t offset;
  uint8_t *start;
  char *in_stack_ffffffffffffffd0;
  ExceptionType in_stack_ffffffffffffffdc;
  
  this_00 = (Exception *)
            ptr((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)0x1327e8);
  while( true ) {
    if (SliceStaticData::TypeMap[*(byte *)this_00] != Tagged) {
      return false;
    }
    if (*(byte *)this_00 == 0xee) {
      in_stack_ffffffffffffffd0 = (char *)readIntegerFixed<unsigned_long,1ul>(&this_00->field_0x1);
      in_stack_ffffffffffffffdc = CONCAT13(2,(int3)in_stack_ffffffffffffffdc);
    }
    else {
      if (*(byte *)this_00 != 0xef) {
        uVar1 = __cxa_allocate_exception(0x18);
        Exception::Exception(this_00,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
        __cxa_throw(uVar1,&Exception::typeinfo,Exception::~Exception);
      }
      in_stack_ffffffffffffffd0 = (char *)readIntegerFixed<unsigned_long,8ul>(&this_00->field_0x1);
      in_stack_ffffffffffffffdc = CONCAT13(9,(int3)in_stack_ffffffffffffffdc);
    }
    if (in_stack_ffffffffffffffd0 == in_RSI) break;
    this_00 = (Exception *)(&this_00->field_0x0 + (int)(in_stack_ffffffffffffffdc >> 0x18));
  }
  return true;
}

Assistant:

bool hasTag(uint64_t tagId) const {
    // always need the actual first byte, so use ptr() directly
    uint8_t const* start = ptr();

    while (SliceStaticData::TypeMap[*start] == ValueType::Tagged) {
      uint8_t offset;
      uint64_t tag;

      if (*start == 0xee) {
        tag = readIntegerFixed<uint64_t, 1>(start + 1);
        offset = 2;
      } else if (*start == 0xef) {
        tag = readIntegerFixed<uint64_t, 8>(start + 1);
        offset = 9;
      } else {
        throw Exception(Exception::InternalError, "Invalid tag type ID");
      }

      if (tag == tagId) {
        return true;
      }

      start += offset;
    }

    return false;
  }